

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

Gia_Man_t * Nf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  undefined1 *puVar1;
  Nf_Mat_t (*paNVar2) [2];
  Nf_Obj_t *pNVar3;
  Vec_Flt_t *pVVar4;
  int iVar5;
  Gia_Man_t *pGVar6;
  Nf_Man_t *p;
  Scl_Con_t *pSVar7;
  word wVar8;
  Vec_Int_t *pVVar9;
  char *pTitle;
  ulong uVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  
  if (pGia->pSibls != (int *)0x0) {
    pPars->fCoarsen = 0;
  }
  pGVar6 = pGia;
  if (pPars->fCoarsen != 0) {
    pGVar6 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
  }
  p = Nf_StoCreate(pGVar6,pPars);
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    putchar(10);
    printf("Derived ");
    Gia_ManPrintMuxStats(pGVar6);
    putchar(10);
  }
  Nf_ManPrintInit(p);
  Nf_ManComputeCuts(p);
  Nf_ManPrintQuit(p);
  pSVar7 = Scl_ConReadMan();
  pGVar6 = p->pGia;
  pVVar9 = pGVar6->vCis;
  if (pSVar7 == (Scl_Con_t *)0x0) {
    if (0 < pVVar9->nSize) {
      lVar12 = 0;
      do {
        iVar5 = pVVar9->pArray[lVar12];
        lVar11 = (long)iVar5;
        if ((lVar11 < 0) || (pGVar6->nObjs <= iVar5)) goto LAB_006fa96e;
        if (iVar5 == 0) break;
        pVVar4 = pGVar6->vInArrs;
        if (pVVar4 == (Vec_Flt_t *)0x0) {
          wVar8 = 0;
        }
        else {
          if (pVVar4->nSize <= lVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          fVar13 = 0.0;
          if (0.0 <= pVVar4->pArray[lVar12]) {
            fVar13 = pVVar4->pArray[lVar12];
          }
          uVar10 = (ulong)(fVar13 * 1000.0);
          wVar8 = (long)(fVar13 * 1000.0 - 9.223372e+18) & (long)uVar10 >> 0x3f | uVar10;
        }
        pNVar3 = p->pNfObjs;
        pNVar3[lVar11].M[1][1].D = wVar8;
        pNVar3[lVar11].M[1][0].D = wVar8;
        pNVar3[lVar11].M[0][1].D = wVar8;
        pNVar3[lVar11].M[0][0].D = wVar8;
        puVar1 = &pNVar3[lVar11].M[1][0].field_0x3;
        *puVar1 = *puVar1 | 0x40;
        pNVar3[lVar11].M[1][0].D = p->InvDelay + wVar8;
        pNVar3[lVar11].M[1][0].A = p->InvArea;
        puVar1 = &pNVar3[lVar11].M[1][1].field_0x3;
        *puVar1 = *puVar1 | 0x40;
        pNVar3[lVar11].M[1][1].D = wVar8 + p->InvDelay;
        pNVar3[lVar11].M[1][1].A = p->InvArea;
        *(uint *)p->pNfObjs[lVar11].M[0] = *(uint *)p->pNfObjs[lVar11].M[0] | 0x80000000;
        paNVar2 = p->pNfObjs[lVar11].M + 1;
        *(uint *)*paNVar2 = *(uint *)*paNVar2 | 0x80000000;
        lVar12 = lVar12 + 1;
        pGVar6 = p->pGia;
        pVVar9 = pGVar6->vCis;
      } while (lVar12 < pVVar9->nSize);
    }
  }
  else if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      iVar5 = pVVar9->pArray[lVar12];
      lVar11 = (long)iVar5;
      if ((lVar11 < 0) || (pGVar6->nObjs <= iVar5)) {
LAB_006fa96e:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar5 == 0) break;
      pSVar7 = Scl_ConReadMan();
      if ((pSVar7->vInArrs).nSize <= lVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      wVar8 = (pSVar7->vInArrs).pArray[lVar12];
      pNVar3 = p->pNfObjs;
      pNVar3[lVar11].M[1][1].D = wVar8;
      pNVar3[lVar11].M[1][0].D = wVar8;
      pNVar3[lVar11].M[0][1].D = wVar8;
      pNVar3[lVar11].M[0][0].D = wVar8;
      puVar1 = &pNVar3[lVar11].M[1][0].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      pNVar3[lVar11].M[1][0].D = p->InvDelay + wVar8;
      pNVar3[lVar11].M[1][0].A = p->InvArea;
      puVar1 = &pNVar3[lVar11].M[1][1].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      pNVar3[lVar11].M[1][1].D = wVar8 + p->InvDelay;
      pNVar3[lVar11].M[1][1].A = p->InvArea;
      *(uint *)p->pNfObjs[lVar11].M[0] = *(uint *)p->pNfObjs[lVar11].M[0] | 0x80000000;
      paNVar2 = p->pNfObjs[lVar11].M + 1;
      *(uint *)*paNVar2 = *(uint *)*paNVar2 | 0x80000000;
      lVar12 = lVar12 + 1;
      pGVar6 = p->pGia;
      pVVar9 = pGVar6->vCis;
    } while (lVar12 < pVVar9->nSize);
  }
  p->Iter = 0;
  if (0 < p->pPars->nRounds) {
    do {
      Nf_ManComputeMapping(p);
      Nf_ManSetMapRefs(p);
      pTitle = "Area ";
      if (p->Iter == 0) {
        pTitle = "Delay";
      }
      Nf_ManPrintStats(p,pTitle);
      iVar5 = p->Iter + 1;
      p->Iter = iVar5;
    } while (iVar5 < p->pPars->nRounds);
  }
  p->fUseEla = 1;
  if (p->Iter < pPars->nRoundsEla + p->pPars->nRounds) {
    do {
      Nf_ManComputeMappingEla(p);
      Nf_ManUpdateStats(p);
      Nf_ManPrintStats(p,"Ela  ");
      iVar5 = p->Iter + 1;
      p->Iter = iVar5;
    } while (iVar5 < pPars->nRoundsEla + p->pPars->nRounds);
  }
  pGVar6 = Nf_ManDeriveMapping(p);
  Nf_StoDelete(p);
  return pGVar6;
}

Assistant:

Gia_Man_t * Nf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = NULL, * pCls;
    Nf_Man_t * p; int i, Id;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCoarsen = 0; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Nf_StoCreate( pCls, pPars );
//    if ( pPars->fVeryVerbose )
//        Nf_StoPrint( p, pPars->fVeryVerbose );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Nf_ManPrintInit( p );
    Nf_ManComputeCuts( p );
    Nf_ManPrintQuit( p );
    if ( Scl_ConIsRunning() )
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
            Nf_ObjPrepareCi( p, Id, Scl_ConGetInArr(i) );
    }
    else
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
            Nf_ObjPrepareCi( p, Id, Nf_Flt2Wrd(p->pGia->vInArrs ? Abc_MaxFloat(0.0, Vec_FltEntry(p->pGia->vInArrs, i)) : 0.0) );
    }
    for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
    {
        Nf_ManComputeMapping( p );
        Nf_ManSetMapRefs( p );
        Nf_ManPrintStats( p, (char *)(p->Iter ? "Area " : "Delay") );
    }

    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
    {
        Nf_ManComputeMappingEla( p );
        Nf_ManUpdateStats( p );
        Nf_ManPrintStats( p, "Ela  " );
    }
    pNew = Nf_ManDeriveMapping( p );
    Nf_StoDelete( p );
    return pNew;
}